

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_types(Parser *this)

{
  Tree *this_00;
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  undefined1 uVar11;
  bool bVar12;
  YamlTag_e YVar13;
  int iVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  pfn_error p_Var18;
  char cVar19;
  long lVar20;
  yml *pyVar21;
  uint uVar22;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  void *pvVar23;
  ulong extraout_RDX_01;
  State *pSVar24;
  size_t i;
  ulong uVar25;
  csubstr cVar26;
  ro_substr chars;
  ro_substr chars_00;
  csubstr fmt;
  ro_substr chars_01;
  csubstr tag;
  ro_substr chars_02;
  char msg [27];
  basic_substring<const_char> local_218;
  basic_substring<const_char> local_208;
  basic_substring<const_char> local_1f8;
  undefined3 uStack_1e8;
  undefined3 uStack_1e5;
  undefined2 uStack_1e2;
  undefined3 uStack_1e0;
  undefined3 uStack_1dd;
  undefined2 uStack_1da;
  undefined8 local_1d8;
  undefined3 uStack_1d0;
  undefined2 uStack_1cd;
  undefined3 uStack_1cb;
  undefined3 uStack_1c8;
  undefined2 uStack_1c5;
  undefined6 uStack_1c3;
  undefined2 uStack_1bd;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  char *pcStack_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  char *pcStack_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  char *pcStack_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  char *pcStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  local_218 = basic_substring<const_char>::triml(&(this->m_state->line_contents).rem,' ');
  uVar25 = local_218.len;
  pcVar15 = local_218.str;
  local_208.str = (char *)0x0;
  local_208.len = 0;
  if (uVar25 < 2) {
LAB_00221a67:
    if (uVar25 == 0) goto LAB_00221f17;
    cVar19 = *pcVar15;
LAB_00221b2a:
    if (cVar19 == '!') {
      sVar16 = basic_substring<const_char>::first_of(&local_218,' ',0);
      if ((sVar16 != 0xffffffffffffffff) && (local_218.len < sVar16)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        handle_error(0x24bbea,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar16 == 0xffffffffffffffff) {
        local_1f8.str = local_218.str;
        local_1f8.len._0_3_ = (undefined3)local_218.len;
        local_1f8.len._3_3_ = local_218.len._3_3_;
        local_1f8.len._6_2_ = local_218.len._6_2_;
      }
      else {
        basic_substring<const_char>::basic_substring(&local_1f8,local_218.str,sVar16);
      }
      local_208.len =
           CONCAT26(local_1f8.len._6_2_,CONCAT33(local_1f8.len._3_3_,(undefined3)local_1f8.len));
      local_208.str = local_1f8.str;
      if ((char *)local_208.len == (char *)0x0) {
        uStack_1e8 = 0x656c2e;
        uStack_1e5 = 0x3e206e;
        uStack_1e2 = 0x203d;
        uStack_1e0 = 0x2931;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_3_ = 0x656c69;
        local_1f8.len._3_3_ = 0x203a64;
        local_1f8.len._6_2_ = 0x7428;
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        p_Var18 = (this->m_stack).m_callbacks.m_error;
        local_f0 = 0;
        uStack_e8 = 0x7241;
        local_e0 = 0;
        pcStack_d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d0 = 0x65;
        pvVar23 = (this->m_stack).m_callbacks.m_user_data;
        uStack_e8._0_4_ = 0x7241;
        uVar22 = (uint)uStack_e8;
LAB_00221f02:
        auVar3 = ZEXT424(uVar22) << 0x40;
        LVar4.name.str._0_4_ = 0x24bb3d;
        LVar4.super_LineCol.offset = auVar3._0_8_;
        LVar4.super_LineCol.line = auVar3._8_8_;
        LVar4.super_LineCol.col = auVar3._16_8_;
        LVar4.name.str._4_4_ = 0;
        LVar4.name.len = 0x65;
        (*p_Var18)((char *)&local_1f8,0x1b,LVar4,pvVar23);
      }
    }
  }
  else {
    cVar19 = *pcVar15;
    if (cVar19 == '!') {
      if (pcVar15[1] != '!') {
        if (pcVar15[1] != '<') goto LAB_00221b24;
        sVar16 = basic_substring<const_char>::first_of(&local_218,'>',0);
        if ((sVar16 != 0xffffffffffffffff) && (local_218.len < sVar16)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar1 = (code *)swi(3);
            uVar11 = (*pcVar1)();
            return (bool)uVar11;
          }
          handle_error(0x24bbea,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1572,"pos <= len || pos == npos");
        }
        if (sVar16 == 0xffffffffffffffff) {
          local_1f8.str = local_218.str;
          local_1f8.len._0_3_ = (undefined3)local_218.len;
          local_1f8.len._3_3_ = local_218.len._3_3_;
          local_1f8.len._6_2_ = local_218.len._6_2_;
        }
        else {
          basic_substring<const_char>::basic_substring(&local_1f8,local_218.str,sVar16 + 1);
        }
        local_208.len =
             CONCAT26(local_1f8.len._6_2_,CONCAT33(local_1f8.len._3_3_,(undefined3)local_1f8.len));
        local_208.str = local_1f8.str;
        if ((char *)0x1 < local_208.len) goto LAB_00221f17;
        uStack_1e8 = 0x656c2e;
        uStack_1e5 = 0x3e206e;
        uStack_1e2 = 0x203d;
        uStack_1e0 = 0x2932;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_3_ = 0x656c69;
        local_1f8.len._3_3_ = 0x203a64;
        local_1f8.len._6_2_ = 0x7428;
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        p_Var18 = (this->m_stack).m_callbacks.m_error;
        local_a0 = 0;
        uStack_98 = 0x7233;
        local_90 = 0;
        pcStack_88 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_80 = 0x65;
        pvVar23 = (this->m_stack).m_callbacks.m_user_data;
        uStack_98._0_4_ = 0x7233;
        uVar22 = (uint)uStack_98;
        goto LAB_00221f02;
      }
      chars.len = 2;
      chars.str = " ,";
      sVar16 = basic_substring<const_char>::first_of(&local_218,chars,0);
      if ((sVar16 != 0xffffffffffffffff) && (local_218.len < sVar16)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        handle_error(0x24bbea,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar16 == 0xffffffffffffffff) {
        local_1f8.str = local_218.str;
        local_1f8.len._0_3_ = (undefined3)local_218.len;
        local_1f8.len._3_3_ = local_218.len._3_3_;
        local_1f8.len._6_2_ = local_218.len._6_2_;
      }
      else {
        basic_substring<const_char>::basic_substring(&local_1f8,local_218.str,sVar16);
      }
      local_208.len =
           CONCAT26(local_1f8.len._6_2_,CONCAT33(local_1f8.len._3_3_,(undefined3)local_1f8.len));
      local_208.str = local_1f8.str;
      if (local_208.len < (char *)0x2) {
        uStack_1e8 = 0x656c2e;
        uStack_1e5 = 0x3e206e;
        uStack_1e2 = 0x203d;
        uStack_1e0 = 0x2932;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_3_ = 0x656c69;
        local_1f8.len._3_3_ = 0x203a64;
        local_1f8.len._6_2_ = 0x7428;
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        local_78 = 0;
        uStack_70 = 0x722a;
        local_68 = 0;
        pcStack_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x65;
        auVar3 = ZEXT1224(ZEXT412(0x722a) << 0x40);
        LVar2.name.str._0_4_ = 0x24bb3d;
        LVar2.super_LineCol.offset = auVar3._0_8_;
        LVar2.super_LineCol.line = auVar3._8_8_;
        LVar2.super_LineCol.col = auVar3._16_8_;
        LVar2.name.str._4_4_ = 0;
        LVar2.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1f8,0x1b,LVar2,(this->m_stack).m_callbacks.m_user_data);
      }
      iVar14 = basic_substring<const_char>::compare(&local_208,"!!set",5);
      if (iVar14 == 0) {
        this->m_state->flags = this->m_state->flags | 0x800;
      }
    }
    else {
LAB_00221b24:
      if (uVar25 == 2) goto LAB_00221b2a;
      lVar20 = 0;
      do {
        if (pcVar15[lVar20] != "!h!"[lVar20]) goto LAB_00221a67;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      sVar16 = basic_substring<const_char>::first_of(&local_218,' ',0);
      if ((sVar16 != 0xffffffffffffffff) && (local_218.len < sVar16)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        handle_error(0x24bbea,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar16 == 0xffffffffffffffff) {
        local_1f8.str = local_218.str;
        local_1f8.len._0_3_ = (undefined3)local_218.len;
        local_1f8.len._3_3_ = local_218.len._3_3_;
        local_1f8.len._6_2_ = local_218.len._6_2_;
      }
      else {
        basic_substring<const_char>::basic_substring(&local_1f8,local_218.str,sVar16);
      }
      local_208.len =
           CONCAT26(local_1f8.len._6_2_,CONCAT33(local_1f8.len._3_3_,(undefined3)local_1f8.len));
      local_208.str = local_1f8.str;
      if (local_208.len < (char *)0x3) {
        uStack_1e8 = 0x656c2e;
        uStack_1e5 = 0x3e206e;
        uStack_1e2 = 0x203d;
        uStack_1e0 = 0x2933;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_3_ = 0x656c69;
        local_1f8.len._3_3_ = 0x203a64;
        local_1f8.len._6_2_ = 0x7428;
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        p_Var18 = (this->m_stack).m_callbacks.m_error;
        local_c8 = 0;
        uStack_c0 = 0x723a;
        local_b8 = 0;
        pcStack_b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_a8 = 0x65;
        pvVar23 = (this->m_stack).m_callbacks.m_user_data;
        uVar22 = 0x723a;
        goto LAB_00221f02;
      }
    }
  }
LAB_00221f17:
  bVar10 = (yml *)local_208.str != (yml *)0x0 && (char *)local_208.len != (char *)0x0;
  if ((yml *)local_208.str == (yml *)0x0 || (char *)local_208.len == (char *)0x0) {
    return bVar10;
  }
  pSVar24 = this->m_state;
  if ((~pSVar24->flags & 0x220U) == 0) {
    if ((pSVar24->flags & 0x40U) == 0) {
      uStack_1e8 = 0x5f7361;
      uStack_1e5 = 0x796e61;
      uStack_1e2 = 0x5228;
      uStack_1e0 = 0x59454b;
      uStack_1dd = 0x2929;
      local_1f8.str = (char *)0x6166206b63656863;
      local_1f8.len._0_3_ = 0x656c69;
      local_1f8.len._3_3_ = 0x203a64;
      local_1f8.len._6_2_ = 0x6828;
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      local_118 = 0;
      uStack_110 = 0x724a;
      local_108 = 0;
      pcStack_100 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f8 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x724a) << 0x40);
      LVar5.name.str._0_4_ = 0x24bb3d;
      LVar5.super_LineCol.offset = auVar3._0_8_;
      LVar5.super_LineCol.line = auVar3._8_8_;
      LVar5.super_LineCol.col = auVar3._16_8_;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1f8,0x1e,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    pcVar15 = (this->m_buf).str;
    if ((local_218.str + -1 < pcVar15) || (pcVar15 + (this->m_buf).len < local_218.str + -1)) {
      uStack_1c8 = 0x667562;
      uStack_1c5 = 0x652e;
      uStack_1c3 = 0x292928646e;
      local_1d8._0_1_ = 'n';
      local_1d8._1_1_ = '(';
      local_1d8._2_1_ = ')';
      local_1d8._3_1_ = ' ';
      local_1d8._4_1_ = '&';
      local_1d8._5_1_ = '&';
      local_1d8._6_1_ = ' ';
      local_1d8._7_1_ = 's';
      uStack_1d0 = 0x207274;
      uStack_1cd = 0x3d3c;
      uStack_1cb = 0x5f6d20;
      uStack_1e8 = 0x207274;
      uStack_1e5 = 0x203d3e;
      uStack_1e2 = 0x5f6d;
      uStack_1e0 = 0x667562;
      uStack_1dd = 0x65622e;
      uStack_1da = 0x6967;
      local_1f8.str = (char *)0x6166206b63656863;
      local_1f8.len._0_3_ = 0x656c69;
      local_1f8.len._3_3_ = 0x203a64;
      local_1f8.len._6_2_ = 0x7328;
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      local_50 = 0;
      uStack_48 = 0x5e96;
      local_40 = 0;
      pcStack_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_30 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x5e96) << 0x40);
      LVar6.name.str._0_4_ = 0x24bb3d;
      LVar6.super_LineCol.offset = auVar3._0_8_;
      LVar6.super_LineCol.line = auVar3._8_8_;
      LVar6.super_LineCol.col = auVar3._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1f8,0x3b,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    _append_key_val(this,(csubstr)ZEXT816(0),0);
    pSVar24 = this->m_state;
    pSVar24->flags = pSVar24->flags & 0xffffffdf;
  }
  cVar26.len = local_208.len;
  cVar26.str = local_208.str;
  sVar16 = LineContents::current_col(&pSVar24->line_contents,cVar26);
  pyVar21 = (yml *)(this->m_state->line_contents).rem.str;
  if ((yml *)(local_208.str + local_208.len) <= pyVar21) {
    uStack_1c8 = 0x6d6572;
    uStack_1c5 = 0x622e;
    uStack_1c3 = 0x29286e696765;
    uStack_1bd = 0x29;
    local_1d8._0_1_ = '-';
    local_1d8._1_1_ = '>';
    local_1d8._2_1_ = 'l';
    local_1d8._3_1_ = 'i';
    local_1d8._4_1_ = 'n';
    local_1d8._5_1_ = 'e';
    local_1d8._6_1_ = '_';
    local_1d8._7_1_ = 'c';
    uStack_1d0 = 0x746e6f;
    uStack_1cd = 0x6e65;
    uStack_1cb = 0x2e7374;
    uStack_1e8 = 0x6e652e;
    uStack_1e5 = 0x292864;
    uStack_1e2 = 0x3e20;
    uStack_1e0 = 0x5f6d20;
    uStack_1dd = 0x617473;
    uStack_1da = 0x6574;
    local_1f8.str = (char *)0x6166206b63656863;
    local_1f8.len._0_3_ = 0x656c69;
    local_1f8.len._3_3_ = 0x203a64;
    local_1f8.len._6_2_ = 0x7428;
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar1 = (code *)swi(3);
      uVar11 = (*pcVar1)();
      return (bool)uVar11;
    }
    local_140 = 0;
    uStack_138 = 0x7255;
    local_130 = 0;
    pcStack_128 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_120 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x7255) << 0x40);
    LVar7.name.str._0_4_ = 0x24bb3d;
    LVar7.super_LineCol.offset = auVar3._0_8_;
    LVar7.super_LineCol.line = auVar3._8_8_;
    LVar7.super_LineCol.col = auVar3._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1f8,0x3d,LVar7,(this->m_stack).m_callbacks.m_user_data);
    pyVar21 = (yml *)(this->m_state->line_contents).rem.str;
  }
  _line_progressed(this,(long)(local_208.len + (long)local_208.str) - (long)pyVar21);
  chars_00.len = 2;
  chars_00.str = " \t";
  sVar17 = basic_substring<const_char>::first_not_of(&(this->m_state->line_contents).rem,chars_00,0)
  ;
  if (sVar17 != 0xffffffffffffffff) {
    _line_progressed(this,sVar17);
  }
  pSVar24 = this->m_state;
  uVar22 = ~pSVar24->flags;
  uVar25 = (ulong)uVar22;
  if ((uVar22 & 0x44) == 0) {
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      uStack_1e8 = 0x656b5f;
      uStack_1e5 = 0x745f79;
      uStack_1e2 = 0x6761;
      uStack_1e0 = 0x6d652e;
      uStack_1dd = 0x797470;
      uStack_1da = 0x2928;
      local_1f8.str = (char *)0x6166206b63656863;
      local_1f8.len._0_3_ = 0x656c69;
      local_1f8.len._3_3_ = 0x203a64;
      local_1f8.len._6_2_ = 0x6d28;
      local_1d8._0_2_ = 0x29;
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      local_168 = 0;
      uStack_160 = 0x7260;
      local_158 = 0;
      pcStack_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_148 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x7260) << 0x40);
      LVar8.name.str._0_4_ = 0x24bb3d;
      LVar8.super_LineCol.offset = auVar3._0_8_;
      LVar8.super_LineCol.line = auVar3._8_8_;
      LVar8.super_LineCol.col = auVar3._16_8_;
      LVar8.name.str._4_4_ = 0;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1f8,0x22,LVar8,(this->m_stack).m_callbacks.m_user_data);
      uVar25 = extraout_RDX;
    }
    (this->m_key_tag).str = local_208.str;
    (this->m_key_tag).len = local_208.len;
  }
  else {
    if ((uVar22 & 0x84) == 0) {
      local_218.str = (pSVar24->line_contents).rem.str;
      sVar17 = (pSVar24->line_contents).rem.len;
      local_218.len = sVar17;
      if (sVar17 != 0) {
        uVar25 = 0;
        do {
          if (local_218.len <= uVar25) {
            _handle_types();
          }
          if (*(yml *)(local_218.str + uVar25) == (yml)0x23) {
            if ((uVar25 != 0xffffffffffffffff) && (local_218.len < uVar25)) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                pcVar1 = (code *)swi(3);
                uVar11 = (*pcVar1)();
                return (bool)uVar11;
              }
              handle_error(0x24bbea,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1569,"pos <= len || pos == npos");
            }
            if (uVar25 != 0xffffffffffffffff) {
              basic_substring<const_char>::basic_substring(&local_1f8,local_218.str,uVar25);
              goto LAB_00222422;
            }
            break;
          }
          uVar25 = uVar25 + 1;
        } while (sVar17 != uVar25);
      }
      local_1f8.str = local_218.str;
      local_1f8.len._0_3_ = (undefined3)local_218.len;
      local_1f8.len._3_3_ = (undefined3)(local_218.len >> 0x18);
      local_1f8.len._6_2_ = (undefined2)(local_218.len >> 0x30);
LAB_00222422:
      local_218.len._3_3_ = local_1f8.len._3_3_;
      local_218.len._0_3_ = (undefined3)local_1f8.len;
      local_218.len._6_2_ = local_1f8.len._6_2_;
      local_218.str = local_1f8.str;
      chars_01.len = 2;
      chars_01.str = " \t";
      local_218 = basic_substring<const_char>::trimr(&local_218,chars_01);
      uVar25 = local_218.len;
      if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) {
        uStack_1e8 = 0x61765f;
        uStack_1e5 = 0x745f6c;
        uStack_1e2 = 0x6761;
        uStack_1e0 = 0x6d652e;
        uStack_1dd = 0x797470;
        uStack_1da = 0x2928;
        local_1f8.str = (char *)0x6166206b63656863;
        local_1f8.len._0_3_ = 0x656c69;
        local_1f8.len._3_3_ = 0x203a64;
        local_1f8.len._6_2_ = 0x6d28;
        local_1d8._0_2_ = 0x29;
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        p_Var18 = (this->m_stack).m_callbacks.m_error;
        local_190 = 0;
        uStack_188 = 0x7279;
        local_180 = 0;
        pcStack_178 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_170 = 0x65;
        pvVar23 = (this->m_stack).m_callbacks.m_user_data;
        uStack_188._0_4_ = 0x7279;
        uVar22 = (uint)uStack_188;
LAB_00222504:
        auVar3 = ZEXT424(uVar22) << 0x40;
        LVar9.name.str._0_4_ = 0x24bb3d;
        LVar9.super_LineCol.offset = auVar3._0_8_;
        LVar9.super_LineCol.line = auVar3._8_8_;
        LVar9.super_LineCol.col = auVar3._16_8_;
        LVar9.name.str._4_4_ = 0;
        LVar9.name.len = 0x65;
        (*p_Var18)((char *)&local_1f8,0x22,LVar9,pvVar23);
        uVar25 = extraout_RDX_01;
      }
LAB_00222519:
      (this->m_val_tag).str = local_208.str;
      (this->m_val_tag).len = local_208.len;
LAB_00222522:
      this->m_val_tag_indentation = sVar16;
      goto LAB_00222529;
    }
    bVar12 = (uVar22 & 0x1003) != 0;
    uVar25 = (ulong)CONCAT31((int3)(uVar22 >> 8),bVar12);
    if ((uVar22 & 0x88) != 0 && bVar12) {
      if ((pSVar24->flags & 2U) == 0) {
        bVar12 = is_debugger_attached();
        if ((bVar12) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        fmt.len = 0x15;
        fmt.str = "ERROR: internal error";
        _err<>(this,fmt);
        uVar25 = extraout_RDX_00;
        goto LAB_00222529;
      }
      local_218.str = (pSVar24->line_contents).rem.str;
      sVar17 = (pSVar24->line_contents).rem.len;
      local_218.len = sVar17;
      if (sVar17 != 0) {
        uVar25 = 0;
        do {
          if (local_218.len <= uVar25) {
            _handle_types();
          }
          if (*(yml *)(local_218.str + uVar25) == (yml)0x23) {
            if ((uVar25 != 0xffffffffffffffff) && (local_218.len < uVar25)) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                pcVar1 = (code *)swi(3);
                uVar11 = (*pcVar1)();
                return (bool)uVar11;
              }
              handle_error(0x24bbea,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1569,"pos <= len || pos == npos");
            }
            if (uVar25 != 0xffffffffffffffff) {
              basic_substring<const_char>::basic_substring(&local_1f8,local_218.str,uVar25);
              goto LAB_002226b8;
            }
            break;
          }
          uVar25 = uVar25 + 1;
        } while (sVar17 != uVar25);
      }
      local_1f8.str = local_218.str;
      local_1f8.len._0_3_ = (undefined3)local_218.len;
      local_1f8.len._3_3_ = (undefined3)(local_218.len >> 0x18);
      local_1f8.len._6_2_ = (undefined2)(local_218.len >> 0x30);
LAB_002226b8:
      local_218.len._3_3_ = local_1f8.len._3_3_;
      local_218.len._0_3_ = (undefined3)local_1f8.len;
      local_218.len._6_2_ = local_1f8.len._6_2_;
      local_218.str = local_1f8.str;
      chars_02.len = 2;
      chars_02.str = " \t";
      local_218 = basic_substring<const_char>::trimr(&local_218,chars_02);
      uVar25 = local_218.len;
      if (local_218.str == (char *)0x0 || uVar25 == 0) {
        if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) {
          uStack_1e8 = 0x61765f;
          uStack_1e5 = 0x745f6c;
          uStack_1e2 = 0x6761;
          uStack_1e0 = 0x6d652e;
          uStack_1dd = 0x797470;
          uStack_1da = 0x2928;
          local_1f8.str = (char *)0x6166206b63656863;
          local_1f8.len._0_3_ = 0x656c69;
          local_1f8.len._3_3_ = 0x203a64;
          local_1f8.len._6_2_ = 0x6d28;
          local_1d8._0_2_ = 0x29;
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar1 = (code *)swi(3);
            uVar11 = (*pcVar1)();
            return (bool)uVar11;
          }
          p_Var18 = (this->m_stack).m_callbacks.m_error;
          local_1b8 = 0;
          uStack_1b0 = 0x7294;
          local_1a8 = 0;
          pcStack_1a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_198 = 0x65;
          pvVar23 = (this->m_stack).m_callbacks.m_user_data;
          uStack_1b0._0_4_ = 0x7294;
          uVar22 = (uint)uStack_1b0;
          goto LAB_00222504;
        }
        goto LAB_00222519;
      }
      if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
        (this->m_key_tag2).str = local_208.str;
        (this->m_key_tag2).len = local_208.len;
        this->m_key_tag2_indentation = sVar16;
        goto LAB_00222529;
      }
      (this->m_key_tag).str = local_208.str;
      (this->m_key_tag).len = local_208.len;
    }
    else {
      if (((this->m_val_tag).len == 0) || ((this->m_val_tag).str == (char *)0x0)) {
        (this->m_val_tag).str = local_208.str;
        (this->m_val_tag).len = local_208.len;
        goto LAB_00222522;
      }
      (this->m_key_tag).str = local_208.str;
      (this->m_key_tag).len = local_208.len;
    }
  }
  this->m_key_tag_indentation = sVar16;
LAB_00222529:
  if (((((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) &&
      (tag.len = uVar25, tag.str = (char *)local_208.len, YVar13 = to_tag((yml *)local_208.str,tag),
      YVar13 == TAG_STR)) && ((~this->m_state->flags & 0x1003U) == 0)) {
    cVar26 = _slurp_doc_scalar(this);
    Tree::to_val(this->m_tree,this->m_state->node_id,cVar26,0x10);
    this_00 = this->m_tree;
    sVar16 = this->m_state->node_id;
    cVar26 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(this_00,sVar16,cVar26);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
    if ((this->m_val_anchor).str != (char *)0x0 && (this->m_val_anchor).len != 0) {
      Tree::set_val_anchor(this->m_tree,this->m_state->node_id,this->m_val_anchor);
      (this->m_val_anchor).str = (char *)0x0;
      (this->m_val_anchor).len = 0;
    }
    _end_stream(this);
  }
  return bVar10;
}

Assistant:

bool Parser::_handle_types()
{
    csubstr rem = m_state->line_contents.rem.triml(' ');
    csubstr t;

    if(rem.begins_with("!!"))
    {
        _c4dbgp("begins with '!!'");
        t = rem.left_of(rem.first_of(" ,"));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2);
        if(t == "!!set")
            add_flags(RSET);
    }
    else if(rem.begins_with("!<"))
    {
        _c4dbgp("begins with '!<'");
        t = rem.left_of(rem.first_of('>'), true);
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2, t.len-1);
    }
    else if(rem.begins_with("!h!"))
    {
        _c4dbgp("begins with '!h!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 3);
        //t = t.sub(3);
    }
    else if(rem.begins_with('!'))
    {
        _c4dbgp("begins with '!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 1);
        //t = t.sub(1);
    }

    if(t.empty())
        return false;

    if(has_all(QMRK|SSCL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
        _c4dbgp("there is a stored key, so this tag is for the next element");
        _append_key_val_null(rem.str - 1);
        rem_flags(QMRK);
    }

    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    const char *tag_beginning = rem.str;
    #endif
    size_t tag_indentation = m_state->line_contents.current_col(t);
    _c4dbgpf("there was a tag: '{}', indentation={}", t, tag_indentation);
    _RYML_CB_ASSERT(m_stack.m_callbacks, t.end() > m_state->line_contents.rem.begin());
    _line_progressed(static_cast<size_t>(t.end() - m_state->line_contents.rem.begin()));
    {
        size_t pos = m_state->line_contents.rem.first_not_of(" \t");
        if(pos != csubstr::npos)
            _line_progressed(pos);
    }

    if(has_all(RMAP|RKEY))
    {
        _c4dbgpf("saving map key tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_key_tag.empty());
        m_key_tag = t;
        m_key_tag_indentation = tag_indentation;
    }
    else if(has_all(RMAP|RVAL))
    {
        /* foo: !!str
         * !!str : bar  */
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        _c4dbgpf("rem='{}'", rem);
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(rem == ':' || rem.begins_with(": "))
        {
            _c4dbgp("the last val was null, and this is a tag from a null key");
            _append_key_val_null(tag_beginning - 1);
            _store_scalar_null(rem.str - 1);
            // do not change the flag to key, it is ~
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.begin() > m_state->line_contents.rem.begin());
            size_t token_len = rem == ':' ? 1 : 2;
            _line_progressed(static_cast<size_t>(token_len + rem.begin() - m_state->line_contents.rem.begin()));
        }
        #endif
        _c4dbgpf("saving map val tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
        m_val_tag = t;
        m_val_tag_indentation = tag_indentation;
    }
    else if(has_all(RSEQ|RVAL) || has_all(RTOP|RUNK|NDOC))
    {
        if(m_val_tag.empty())
        {
            _c4dbgpf("saving seq/doc val tag '{}'", t);
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving seq/doc key tag '{}'", t);
            m_key_tag = t;
            m_key_tag_indentation = tag_indentation;
        }
    }
    else if(has_all(RTOP|RUNK) || has_any(RUNK))
    {
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        if(rem.empty())
        {
            _c4dbgpf("saving val tag '{}'", t);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving key tag '{}'", t);
            if(m_key_tag.empty())
            {
                m_key_tag = t;
                m_key_tag_indentation = tag_indentation;
            }
            else
            {
                /* handle this case:
                 * !!str foo: !!map
                 *   !!int 1: !!float 20.0
                 *   !!int 3: !!float 40.0
                 *
                 * (m_key_tag would be !!str and m_key_tag2 would be !!int)
                 */
                m_key_tag2 = t;
                m_key_tag2_indentation = tag_indentation;
            }
        }
    }
    else
    {
        _c4err("internal error");
    }

    if(m_val_tag.not_empty())
    {
        YamlTag_e tag = to_tag(t);
        if(tag == TAG_STR)
        {
            _c4dbgpf("tag '{}' is a str-type tag", t);
            if(has_all(RTOP|RUNK|NDOC))
            {
                _c4dbgpf("docval. slurping the string. pos={}", m_state->pos.offset);
                csubstr scalar = _slurp_doc_scalar();
                _c4dbgpf("docval. after slurp: {}, at node {}: '{}'", m_state->pos.offset, m_state->node_id, scalar);
                m_tree->to_val(m_state->node_id, scalar, DOC);
                _c4dbgpf("docval. val tag {} -> {}", m_val_tag, normalize_tag(m_val_tag));
                m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
                m_val_tag.clear();
                if(!m_val_anchor.empty())
                {
                    _c4dbgpf("setting val anchor[{}]='{}'", m_state->node_id, m_val_anchor);
                    m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                    m_val_anchor.clear();
                }
                _end_stream();
            }
        }
    }
    return true;
}